

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTexture.cpp
# Opt level: O2

void __thiscall
glu::Texture3D::loadCompressed
          (Texture3D *this,int numLevels,CompressedTexture *levels,
          TexDecompressionParams *decompressionParams)

{
  undefined8 uVar1;
  int iVar2;
  deUint32 err;
  undefined4 extraout_var;
  TestError *this_00;
  NotSupportedError *this_01;
  ulong uVar4;
  ulong uVar5;
  ulong uVar6;
  allocator<char> local_79;
  long local_78;
  deUint32 local_6c;
  TexDecompressionParams *local_68;
  Texture3D *local_60;
  PixelBufferAccess refLevelAccess;
  long lVar3;
  
  local_68 = decompressionParams;
  iVar2 = (*this->m_context->_vptr_RenderContext[3])();
  lVar3 = CONCAT44(extraout_var,iVar2);
  local_6c = getGLFormat(levels->m_format);
  local_78 = lVar3;
  if (*(long *)(lVar3 + 0x290) == 0) {
    this_01 = (NotSupportedError *)__cxa_allocate_exception(0x38);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&refLevelAccess,"glCompressedTexImage3D() is not supported",&local_79);
    tcu::NotSupportedError::NotSupportedError(this_01,(string *)&refLevelAccess);
    __cxa_throw(this_01,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
  }
  if (this->m_glTexture == 0) {
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,"m_glTexture",
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x2e9);
  }
  else {
    (**(code **)(lVar3 + 0xb8))(0x806f);
    uVar6 = 0;
    uVar5 = (ulong)(uint)numLevels;
    if (numLevels < 1) {
      uVar5 = uVar6;
    }
    uVar4 = 0;
    local_60 = this;
    while( true ) {
      if (uVar5 == uVar4) {
        err = (**(code **)(local_78 + 0x800))();
        checkError(err,"Texture upload failed",
                   "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
                   ,0x2fd);
        return;
      }
      tcu::Texture3D::allocLevel(&this->m_refTexture,(int)uVar4);
      tcu::ConstPixelBufferAccess::ConstPixelBufferAccess
                (&refLevelAccess.super_ConstPixelBufferAccess,
                 (ConstPixelBufferAccess *)
                 ((long)(((local_60->m_refTexture).super_TextureLevelPyramid.m_access.
                          super__Vector_base<tcu::PixelBufferAccess,_std::allocator<tcu::PixelBufferAccess>_>
                          ._M_impl.super__Vector_impl_data._M_start)->super_ConstPixelBufferAccess).
                        m_size.m_data + (uVar6 - 8)));
      if (((*(int *)((long)&levels->m_width + uVar6) !=
            refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[0]) ||
          (*(int *)((long)&levels->m_height + uVar6) !=
           refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[1])) ||
         (*(int *)((long)&levels->m_depth + uVar6) !=
          refLevelAccess.super_ConstPixelBufferAccess.m_size.m_data[2])) break;
      tcu::CompressedTexture::decompress
                ((CompressedTexture *)((long)&levels->m_format + uVar6),
                 (PixelBufferAccess *)&refLevelAccess.super_ConstPixelBufferAccess,local_68);
      uVar1 = *(undefined8 *)
               ((long)&(levels->m_data).
                       super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                       super__Vector_impl_data._M_start + uVar6);
      (**(code **)(local_78 + 0x290))
                (0x806f,uVar4 & 0xffffffff,local_6c,*(undefined4 *)((long)&levels->m_width + uVar6),
                 *(undefined4 *)((long)&levels->m_height + uVar6),
                 *(undefined4 *)((long)&levels->m_depth + uVar6),0,
                 *(int *)((long)&(levels->m_data).
                                 super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                 _M_impl.super__Vector_impl_data._M_finish + uVar6) - (int)uVar1,
                 uVar1);
      uVar4 = uVar4 + 1;
      uVar6 = uVar6 + 0x28;
    }
    this_00 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (this_00,(char *)0x0,
               "level.getWidth() == refLevelAccess.getWidth() && level.getHeight() == refLevelAccess.getHeight() && level.getDepth() == refLevelAccess.getDepth()"
               ,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/framework/opengl/gluTexture.cpp"
               ,0x2f5);
  }
  __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

void Texture3D::loadCompressed (int numLevels, const tcu::CompressedTexture* levels, const tcu::TexDecompressionParams& decompressionParams)
{
	const glw::Functions&	gl					= m_context.getFunctions();
	deUint32				compressedFormat	= getGLFormat(levels[0].getFormat());

	if (!gl.compressedTexImage3D)
		throw tcu::NotSupportedError("glCompressedTexImage3D() is not supported");

	TCU_CHECK(m_glTexture);
	gl.bindTexture(GL_TEXTURE_3D, m_glTexture);

	for (int levelNdx = 0; levelNdx < numLevels; levelNdx++)
	{
		const tcu::CompressedTexture& level = levels[levelNdx];

		// Decompress to reference texture.
		m_refTexture.allocLevel(levelNdx);
		tcu::PixelBufferAccess refLevelAccess = m_refTexture.getLevel(levelNdx);
		TCU_CHECK(level.getWidth()	== refLevelAccess.getWidth() &&
				  level.getHeight()	== refLevelAccess.getHeight() &&
				  level.getDepth()	== refLevelAccess.getDepth());
		level.decompress(refLevelAccess, decompressionParams);

		// Upload to GL texture in compressed form.
		gl.compressedTexImage3D(GL_TEXTURE_3D, levelNdx, compressedFormat,
								level.getWidth(), level.getHeight(), level.getDepth(), 0 /* border */, level.getDataSize(), level.getData());
	}

	GLU_EXPECT_NO_ERROR(gl.getError(), "Texture upload failed");
}